

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Link.cpp
# Opt level: O0

void __thiscall TGenericLinker::~TGenericLinker(TGenericLinker *this)

{
  TGenericLinker *this_local;
  
  (this->super_TLinker).super_TShHandleBase._vptr_TShHandleBase =
       (_func_int **)&PTR__TGenericLinker_010dd430;
  TInfoSink::~TInfoSink(&this->infoSink);
  TLinker::~TLinker(&this->super_TLinker);
  return;
}

Assistant:

bool link(TCompilerList&, TUniformMap*) { return true; }